

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

void (anonymous_namespace)::
     DeserializeFileDB<ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>>
               (path *path,
               ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>
               *data)

{
  long lVar1;
  bool bVar2;
  FILE *stream;
  undefined8 *puVar3;
  FILE *in_RSI;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  FILE *file;
  AutoFile filein;
  AutoFile *in_stack_ffffffffffffff58;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff87;
  ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>
  *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  stream = fsbridge::fopen((char *)in_RDI,"rb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffff58);
  AutoFile::AutoFile(in_RDI,in_RSI,(vector<std::byte,_std::allocator<std::byte>_> *)stream);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(in_stack_ffffffffffffff68);
  bVar2 = AutoFile::IsNull(in_stack_ffffffffffffff58);
  if (bVar2) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = 0;
    anon_unknown.dwarf_ae4bec::DbNotFoundError::DbNotFoundError
              ((DbNotFoundError *)in_stack_ffffffffffffff58);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(puVar3,&DbNotFoundError::typeinfo,
                  anon_unknown.dwarf_ae4bec::DbNotFoundError::~DbNotFoundError);
    }
  }
  else {
    DeserializeDB<AutoFile,ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>&>
              ((AutoFile *)stream,in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
    AutoFile::~AutoFile(in_stack_ffffffffffffff58);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeFileDB(const fs::path& path, Data&& data)
{
    FILE* file = fsbridge::fopen(path, "rb");
    AutoFile filein{file};
    if (filein.IsNull()) {
        throw DbNotFoundError{};
    }
    DeserializeDB(filein, data);
}